

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csafestring.c
# Opt level: O1

void safe_resizeBuffer(csafestring_t *obj,size_t newLength)

{
  ulong uVar1;
  char *__s;
  ulong __size;
  char *__dest;
  size_t __n;
  ulong uVar2;
  
  uVar2 = newLength + 1;
  uVar1 = obj->buffer_length;
  __size = uVar1;
  if (uVar1 < uVar2) {
    do {
      __size = __size * 2;
    } while (__size < uVar2);
    obj->buffer_length = __size;
  }
  if (uVar1 < uVar2) {
    __dest = (char *)calloc(1,__size);
    __s = obj->data;
    __n = strlen(__s);
    memmove(__dest,__s,__n);
    free(__s);
    obj->data = __dest;
  }
  return;
}

Assistant:

void safe_resizeBuffer(csafestring_t *obj, size_t newLength) {
	char hit = 0;
	newLength++;

	while ( obj->buffer_length < newLength ) {
		hit = 1;
		obj->buffer_length <<= 1;
#ifdef EXPERIMENTAL_SIZING
		obj->sizing_size++;
		sizing_size++;
#endif
	}
	if ( hit ) {
		char *tmp = (char *) calloc(sizeof(char), obj->buffer_length);
		memmove(tmp, obj->data, strlen(obj->data));
		free(obj->data);
		obj->data = tmp;
	}
}